

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celfpp.h
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> *
CELFPP::celfppalgo(vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
                  Graph *graph,double budget,vector<double,_std::allocator<double>_> *budget_list,
                  CascadeModel model)

{
  iterator iVar1;
  ulong uVar2;
  pointer pdVar3;
  _Elt_pointer ptVar4;
  _Map_pointer pptVar5;
  _Elt_pointer ptVar6;
  _Elt_pointer ptVar7;
  _Elt_pointer ptVar8;
  _Map_pointer pptVar9;
  int iVar10;
  ostream *poVar11;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar12;
  undefined8 *puVar13;
  long lVar14;
  long lVar15;
  _Head_base<2UL,_int,_false> _Var16;
  ulong uVar17;
  _Head_base<5UL,_double,_false> _Var18;
  double dVar19;
  double dVar20;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar21 [16];
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar22 [16];
  _Elt_pointer ptVar23;
  _Elt_pointer ptVar24;
  vector<unsigned_long,_std::allocator<unsigned_long>_> vecSeed;
  tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> u;
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  Q_CB;
  deque<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  Q_UC;
  int local_27c;
  double local_278;
  double dStack_270;
  int local_268;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_238;
  double local_220;
  unsigned_long *local_218;
  iterator iStack_210;
  unsigned_long *local_208;
  double local_1f8;
  undefined8 uStack_1f0;
  vector<double,_std::allocator<double>_> *local_1e0;
  undefined1 local_1d8 [32];
  _Head_base<1UL,_double,_false> local_1b8;
  _Head_base<0UL,_unsigned_long,_false> _Stack_1b0;
  double local_1a8;
  _Elt_pointer local_1a0;
  _Elt_pointer local_198;
  _Elt_pointer local_190;
  _Map_pointer local_188;
  _Elt_pointer local_180;
  double local_178;
  double dStack_170;
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  local_168;
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  local_118;
  double local_c8;
  undefined8 uStack_c0;
  _Elt_pointer local_b8;
  double dStack_b0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_a0;
  _Elt_pointer local_98;
  _Elt_pointer local_90;
  _Elt_pointer local_88;
  _Map_pointer local_80;
  _Elt_pointer local_78;
  _Elt_pointer local_70;
  _Elt_pointer local_68;
  _Map_pointer local_60;
  _Elt_pointer local_58;
  _Elt_pointer local_50;
  _Elt_pointer local_48;
  _Map_pointer local_40;
  _Elt_pointer local_38;
  
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
  local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (unsigned_long *)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_118._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1e0 = budget_list;
  local_1a8 = budget;
  local_a0 = __return_storage_ptr__;
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::_M_initialize_map(&local_118,0);
  local_168._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_168._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::_M_initialize_map(&local_168,0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Initial deque start",0x13);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_218 = (unsigned_long *)0x0;
  iStack_210._M_current = (unsigned_long *)0x0;
  local_208 = (unsigned_long *)0x0;
  local_1a0 = (_Elt_pointer)0x0;
  if ((graph->
      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (graph->
      super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    local_178 = 0.0;
    local_27c = -1;
    local_1f8 = (double)CONCAT44(local_1f8._4_4_,0xffffffff);
    local_180 = (_Elt_pointer)0x0;
  }
  else {
    local_1f8 = (double)CONCAT44(local_1f8._4_4_,0xffffffff);
    local_180 = (_Elt_pointer)0x0;
    local_178 = 0.0;
    local_27c = -1;
    do {
      if (iStack_210._M_current == local_208) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_218,iStack_210,
                   (unsigned_long *)&local_1a0);
      }
      else {
        *iStack_210._M_current = (unsigned_long)local_1a0;
        iStack_210._M_current = iStack_210._M_current + 1;
      }
      dVar19 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                         &local_218,model,10000);
      if (iStack_210._M_current != local_218) {
        uVar17 = 0;
        do {
          poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
          std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
          uVar17 = uVar17 + 1;
        } while (uVar17 < (ulong)((long)iStack_210._M_current - (long)local_218 >> 3));
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      _Var16._M_head_impl = local_1f8._0_4_;
      dVar20 = dVar19;
      if (local_1f8._0_4_ != -1) {
        local_1d8._0_8_ = SEXT48(local_1f8._0_4_);
        if (iStack_210._M_current == local_208) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_218,iStack_210,
                     (unsigned_long *)local_1d8);
        }
        else {
          *iStack_210._M_current = local_1d8._0_8_;
          iStack_210._M_current = iStack_210._M_current + 1;
        }
        dVar20 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &local_218,model,10000);
        if (iStack_210._M_current != local_218) {
          uVar17 = 0;
          do {
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            uVar17 = uVar17 + 1;
          } while (uVar17 < (ulong)((long)iStack_210._M_current - (long)local_218 >> 3));
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        iStack_210._M_current = iStack_210._M_current + -1;
        _Var16._M_head_impl = local_1f8._0_4_;
      }
      local_1d8._0_8_ =
           (local_1e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[(long)local_1a0];
      local_1d8._8_8_ = 0;
      local_1d8._24_4_ = _Var16._M_head_impl;
      _Stack_1b0._M_head_impl = (unsigned_long)local_1a0;
      local_1d8._16_8_ = dVar20;
      local_1b8._M_head_impl = dVar19;
      std::
      deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
      ::emplace_back<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>
                ((deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
                  *)&local_118,
                 (tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)local_1d8);
      if ((_Var16._M_head_impl == -1) || (local_178 < dVar19)) {
        local_1f8 = (double)CONCAT44(local_1f8._4_4_,(int)local_1a0);
        local_178 = dVar19;
      }
      ptVar23 = (_Elt_pointer)
                (dVar19 / (local_1e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_start[(long)local_1a0]);
      ptVar24 = ptVar23;
      if (local_27c != -1) {
        _Var18._M_head_impl = (double)(long)local_27c;
        local_1d8._0_8_ = _Var18._M_head_impl;
        if (iStack_210._M_current == local_208) {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
          _M_realloc_insert<unsigned_long>
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_218,iStack_210,
                     (unsigned_long *)local_1d8);
        }
        else {
          *iStack_210._M_current = (unsigned_long)_Var18._M_head_impl;
          iStack_210._M_current = iStack_210._M_current + 1;
        }
        dVar19 = GraphBase::inf_eval(graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                           &local_218,model,10000);
        pdVar3 = (local_1e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        local_220 = pdVar3[(long)local_1a0] + pdVar3[(long)_Var18._M_head_impl];
        if (iStack_210._M_current != local_218) {
          uVar17 = 0;
          do {
            poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
            uVar17 = uVar17 + 1;
          } while (uVar17 < (ulong)((long)iStack_210._M_current - (long)local_218 >> 3));
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
        std::ostream::put(-0x28);
        std::ostream::flush();
        ptVar24 = (_Elt_pointer)(dVar19 / local_220);
        iStack_210._M_current = iStack_210._M_current + -1;
      }
      local_1d8._0_8_ =
           (local_1e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[(long)local_1a0];
      local_1d8._8_8_ = (_Elt_pointer)0x0;
      local_1d8._24_4_ = local_27c;
      _Stack_1b0._M_head_impl = (unsigned_long)local_1a0;
      local_1d8._16_8_ = ptVar24;
      local_1b8._M_head_impl = (double)ptVar23;
      std::
      deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
      ::emplace_back<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>
                ((deque<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::allocator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>>>
                  *)&local_168,
                 (tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double> *)local_1d8);
      if ((local_27c == -1) || ((double)local_180 < (double)ptVar23)) {
        local_27c = (int)local_1a0;
        local_180 = ptVar23;
      }
      iStack_210._M_current = iStack_210._M_current + -1;
      local_1a0 = (_Elt_pointer)
                  ((long)&(local_1a0->
                          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                          ).super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                          super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                          super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                          super__Tuple_impl<4UL,_unsigned_long,_double>.
                          super__Tuple_impl<5UL,_double>.super__Head_base<5UL,_double,_false> + 1);
    } while (local_1a0 <
             (_Elt_pointer)
             (((long)(graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(graph->
                     super__Vector_base<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  local_220 = (double)CONCAT44(local_220._4_4_,model);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Initial deque end",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  pptVar9 = local_118._M_impl.super__Deque_impl_data._M_finish._M_node;
  ptVar8 = local_118._M_impl.super__Deque_impl_data._M_finish._M_last;
  ptVar7 = local_118._M_impl.super__Deque_impl_data._M_finish._M_first;
  ptVar6 = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pptVar5 = local_118._M_impl.super__Deque_impl_data._M_start._M_node;
  ptVar4 = local_118._M_impl.super__Deque_impl_data._M_start._M_last;
  ptVar23 = local_118._M_impl.super__Deque_impl_data._M_start._M_first;
  ptVar24 = local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_118._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_118._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_1d8._0_8_ = local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1d8._8_8_ = local_118._M_impl.super__Deque_impl_data._M_start._M_first;
    local_1d8._16_8_ = local_118._M_impl.super__Deque_impl_data._M_start._M_last;
    local_1d8._24_8_ = local_118._M_impl.super__Deque_impl_data._M_start._M_node;
    local_1a0 = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_198 = local_118._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_190 = local_118._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_188 = local_118._M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar17 = ((long)local_118._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_118._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) *
             -0x5555555555555555 +
             ((long)local_118._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_118._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) *
             -0x5555555555555555 +
             (((long)local_118._M_impl.super__Deque_impl_data._M_finish._M_node -
               (long)local_118._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(local_118._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                    )) * 10;
    lVar14 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>>
              (local_1d8,&local_1a0,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    local_78 = ptVar24;
    local_70 = ptVar23;
    local_68 = ptVar4;
    local_60 = pptVar5;
    local_98 = ptVar6;
    local_90 = ptVar7;
    local_88 = ptVar8;
    local_80 = pptVar9;
    std::
    __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_1_>>
              ();
  }
  pptVar9 = local_168._M_impl.super__Deque_impl_data._M_finish._M_node;
  ptVar8 = local_168._M_impl.super__Deque_impl_data._M_finish._M_last;
  ptVar7 = local_168._M_impl.super__Deque_impl_data._M_finish._M_first;
  ptVar6 = local_168._M_impl.super__Deque_impl_data._M_finish._M_cur;
  pptVar5 = local_168._M_impl.super__Deque_impl_data._M_start._M_node;
  ptVar4 = local_168._M_impl.super__Deque_impl_data._M_start._M_last;
  ptVar23 = local_168._M_impl.super__Deque_impl_data._M_start._M_first;
  ptVar24 = local_168._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (local_168._M_impl.super__Deque_impl_data._M_start._M_cur !=
      local_168._M_impl.super__Deque_impl_data._M_finish._M_cur) {
    local_1d8._0_8_ = local_168._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_1d8._8_8_ = local_168._M_impl.super__Deque_impl_data._M_start._M_first;
    local_1d8._16_8_ = local_168._M_impl.super__Deque_impl_data._M_start._M_last;
    local_1d8._24_8_ = local_168._M_impl.super__Deque_impl_data._M_start._M_node;
    local_1a0 = local_168._M_impl.super__Deque_impl_data._M_finish._M_cur;
    local_198 = local_168._M_impl.super__Deque_impl_data._M_finish._M_first;
    local_190 = local_168._M_impl.super__Deque_impl_data._M_finish._M_last;
    local_188 = local_168._M_impl.super__Deque_impl_data._M_finish._M_node;
    uVar17 = ((long)local_168._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)local_168._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) *
             -0x5555555555555555 +
             ((long)local_168._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)local_168._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) *
             -0x5555555555555555 +
             (((long)local_168._M_impl.super__Deque_impl_data._M_finish._M_node -
               (long)local_168._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
             (ulong)(local_168._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0
                    )) * 10;
    lVar14 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar14 == 0; lVar14 = lVar14 + -1) {
      }
    }
    std::
    __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>>
              (local_1d8,&local_1a0,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
    local_78 = ptVar24;
    local_70 = ptVar23;
    local_68 = ptVar4;
    local_60 = pptVar5;
    local_98 = ptVar6;
    local_90 = ptVar7;
    local_88 = ptVar8;
    local_80 = pptVar9;
    std::
    __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_2_>>
              ();
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start UC",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_268 = -1;
  local_c8 = 0.0;
  uStack_c0 = 0;
  if (0.0 < local_1a8) {
    local_268 = -1;
    local_278 = 0.0;
    dStack_270 = 0.0;
    uVar17 = 0;
    local_c8 = 0.0;
    uStack_c0 = 0;
LAB_0011bac2:
    do {
      if (local_1a8 <
          (double)((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
                  super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>)
                  .super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                  super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                  super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                  super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
                  super__Head_base<5UL,_double,_false> + local_278) {
        if (local_118._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_118._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_118._M_impl.super__Deque_impl_data._M_start._M_first,0x1e0);
          local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_118._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_118._M_impl.super__Deque_impl_data._M_start._M_last =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 10;
          local_118._M_impl.super__Deque_impl_data._M_start._M_first =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_118._M_impl.super__Deque_impl_data._M_start._M_node =
               local_118._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_118._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0011bac2;
      }
      if (local_118._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_118._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      local_1d8._0_8_ =
           ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
           super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
           super__Head_base<5UL,_double,_false>;
      local_1d8._8_8_ =
           ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
           super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>
           ._M_head_impl;
      local_1d8._16_8_ =
           ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
           super__Head_base<3UL,_double,_false>._M_head_impl;
      local_1d8._24_8_ =
           *(undefined8 *)
            &((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
             super__Head_base<2UL,_int,_false>;
      local_1b8._M_head_impl =
           ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
           super__Head_base<1UL,_double,_false>._M_head_impl;
      _Stack_1b0._M_head_impl =
           ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      if ((_Elt_pointer)local_1d8._8_8_ ==
          (_Elt_pointer)
          ((long)local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start >> 3)) {
        if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_238,
                     (iterator)
                     local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&_Stack_1b0._M_head_impl);
        }
        else {
          *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = _Stack_1b0._M_head_impl;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_118._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_118._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_118._M_impl.super__Deque_impl_data._M_start._M_first,0x1e0);
          local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_118._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_118._M_impl.super__Deque_impl_data._M_start._M_last =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 10;
          local_118._M_impl.super__Deque_impl_data._M_start._M_first =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_118._M_impl.super__Deque_impl_data._M_start._M_node =
               local_118._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_118._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_118._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        local_278 = local_278 + (double)local_1d8._0_8_;
        local_b8 = (_Elt_pointer)(local_278 - 9.223372036854776e+18);
        dStack_b0 = dStack_270;
        local_c8 = GraphBase::inf_eval(graph,&local_238,local_220._0_4_,10000);
        local_268 = (int)_Stack_1b0._M_head_impl;
        uStack_c0 = extraout_XMM0_Qb;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"UC push new seed: ",0x12);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        if ((long)local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0) {
          dVar19 = 0.0;
        }
        else {
          lVar14 = (long)local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          dVar19 = 0.0;
          lVar15 = 0;
          do {
            dVar19 = dVar19 + (local_1e0->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start
                              [local_238.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar15]];
            lVar15 = lVar15 + 1;
          } while (lVar14 + (ulong)(lVar14 == 0) != lVar15);
        }
        poVar11 = std::ostream::_M_insert<double>(dVar19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        poVar11 = std::ostream::_M_insert<double>(local_c8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        uVar17 = (ulong)local_278;
        uVar17 = (long)(double)local_b8 & (long)uVar17 >> 0x3f | uVar17;
      }
      else {
        if (local_1d8._24_4_ == local_268) {
          ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Head_base<1UL,_double,_false>._M_head_impl =
               ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
               super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
               super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
               super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
               super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
               super__Head_base<3UL,_double,_false>._M_head_impl;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"last seed",9);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
          std::ostream::put(-0x28);
          std::ostream::flush();
        }
        else {
          if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_238,
                       (iterator)
                       local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&_Stack_1b0._M_head_impl);
          }
          else {
            *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = _Stack_1b0._M_head_impl;
            local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          dVar19 = GraphBase::inf_eval(graph,&local_238,local_220._0_4_,10000);
          ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Head_base<1UL,_double,_false>._M_head_impl = dVar19 - local_c8;
          iVar1._M_current =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
          super__Head_base<2UL,_int,_false>._M_head_impl = local_1f8._0_4_;
          local_1a0 = (_Elt_pointer)(long)local_1f8._0_4_;
          if (iVar1._M_current ==
              local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(&local_238,iVar1,(unsigned_long *)&local_1a0);
          }
          else {
            local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish[-1] = (unsigned_long)local_1a0;
          }
          if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_238,
                       (iterator)
                       local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&_Stack_1b0._M_head_impl);
          }
          else {
            *local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = _Stack_1b0._M_head_impl;
            local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          dVar19 = GraphBase::inf_eval(graph,&local_238,local_220._0_4_,10000);
          ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<3UL,_double,_unsigned_long,_double>.super__Head_base<3UL,_double,_false>
          ._M_head_impl = dVar19 - local_c8;
          local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + -2;
        }
        pptVar9 = local_118._M_impl.super__Deque_impl_data._M_finish._M_node;
        ptVar6 = local_118._M_impl.super__Deque_impl_data._M_finish._M_first;
        ptVar4 = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur;
        pptVar5 = local_118._M_impl.super__Deque_impl_data._M_start._M_node;
        ptVar23 = local_118._M_impl.super__Deque_impl_data._M_start._M_last;
        ptVar24 = local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_1f8._0_4_ == -1) {
          puVar13 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar13 = "cur_best_UC should not be -1";
          __cxa_throw(puVar13,&char_const*::typeinfo,0);
        }
        iVar10 = local_1f8._0_4_;
        if (local_178 <
            ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
            super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
            super__Head_base<1UL,_double,_false>._M_head_impl) {
          iVar10 = (int)((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
                        super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                        ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        }
        local_1f8 = (double)CONCAT44(local_1f8._4_4_,iVar10);
        ((local_118._M_impl.super__Deque_impl_data._M_start._M_cur)->
        super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
        super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>.
        _M_head_impl = (long)local_238.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_238.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
        if (local_118._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_118._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          local_1a0 = local_118._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_38 = local_118._M_impl.super__Deque_impl_data._M_start._M_first;
          local_198 = local_118._M_impl.super__Deque_impl_data._M_start._M_first;
          local_190 = local_118._M_impl.super__Deque_impl_data._M_start._M_last;
          local_188 = local_118._M_impl.super__Deque_impl_data._M_start._M_node;
          local_78 = local_118._M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_70 = local_118._M_impl.super__Deque_impl_data._M_finish._M_first;
          local_b8 = local_118._M_impl.super__Deque_impl_data._M_finish._M_last;
          local_68 = local_118._M_impl.super__Deque_impl_data._M_finish._M_last;
          local_60 = local_118._M_impl.super__Deque_impl_data._M_finish._M_node;
          uVar2 = ((long)local_118._M_impl.super__Deque_impl_data._M_start._M_last -
                   (long)local_118._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) *
                  -0x5555555555555555 +
                  ((long)local_118._M_impl.super__Deque_impl_data._M_finish._M_cur -
                   (long)local_118._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) *
                  -0x5555555555555555 +
                  (((long)local_118._M_impl.super__Deque_impl_data._M_finish._M_node -
                    (long)local_118._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                  (ulong)(local_118._M_impl.super__Deque_impl_data._M_finish._M_node ==
                         (_Map_pointer)0x0)) * 10;
          lVar14 = 0x3f;
          if (uVar2 != 0) {
            for (; uVar2 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          std::
          __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>>
                    (&local_1a0,&local_78,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
          local_98 = ptVar24;
          local_90 = local_38;
          local_88 = ptVar23;
          local_80 = pptVar5;
          local_58 = ptVar4;
          local_50 = ptVar6;
          local_48 = local_b8;
          local_40 = pptVar9;
          std::
          __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_3_>>
                    (&local_98,&local_58);
        }
      }
      auVar21._8_4_ = (int)(uVar17 >> 0x20);
      auVar21._0_8_ = uVar17;
      auVar21._12_4_ = 0x45300000;
      dStack_270 = auVar21._8_8_ - 1.9342813113834067e+25;
      local_278 = dStack_270 + ((double)CONCAT44(0x43300000,(int)uVar17) - 4503599627370496.0);
    } while (local_278 < local_1a8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End UC",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start CB",8);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  local_1f8 = 0.0;
  uStack_1f0 = 0;
  if (0.0 < local_1a8) {
    local_278 = 0.0;
    dStack_270 = 0.0;
    dVar19 = 0.0;
    local_1f8 = 0.0;
    uStack_1f0 = 0;
LAB_0011c1e8:
    do {
      if (local_1a8 <
          (double)((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
                  super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>)
                  .super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
                  super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
                  super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
                  super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
                  super__Head_base<5UL,_double,_false> + local_278) {
        if (local_168._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_168._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_168._M_impl.super__Deque_impl_data._M_start._M_first,0x1e0);
          local_168._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_168._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_168._M_impl.super__Deque_impl_data._M_start._M_last =
               local_168._M_impl.super__Deque_impl_data._M_start._M_cur + 10;
          local_168._M_impl.super__Deque_impl_data._M_start._M_first =
               local_168._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_168._M_impl.super__Deque_impl_data._M_start._M_node =
               local_168._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_168._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_168._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        if (local_168._M_impl.super__Deque_impl_data._M_finish._M_cur !=
            local_168._M_impl.super__Deque_impl_data._M_start._M_cur) goto LAB_0011c1e8;
      }
      if (local_168._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_168._M_impl.super__Deque_impl_data._M_start._M_cur) break;
      local_1d8._0_8_ =
           ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
           super__Tuple_impl<4UL,_unsigned_long,_double>.super__Tuple_impl<5UL,_double>.
           super__Head_base<5UL,_double,_false>;
      local_1d8._8_8_ =
           ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
           super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>
           ._M_head_impl;
      local_1d8._16_8_ =
           ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
           super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
           super__Head_base<3UL,_double,_false>._M_head_impl;
      local_1d8._24_8_ =
           *(undefined8 *)
            &((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
             super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
             super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
             super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
             super__Head_base<2UL,_int,_false>;
      local_1b8._M_head_impl =
           ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
           super__Head_base<1UL,_double,_false>._M_head_impl;
      _Stack_1b0._M_head_impl =
           ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
           super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      if ((_Elt_pointer)local_1d8._8_8_ ==
          (_Elt_pointer)
          ((long)local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start >> 3)) {
        if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_258,
                     (iterator)
                     local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,&_Stack_1b0._M_head_impl);
        }
        else {
          *local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish = _Stack_1b0._M_head_impl;
          local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (local_168._M_impl.super__Deque_impl_data._M_start._M_cur ==
            local_168._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
          operator_delete(local_168._M_impl.super__Deque_impl_data._M_start._M_first,0x1e0);
          local_168._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_168._M_impl.super__Deque_impl_data._M_start._M_node[1];
          local_168._M_impl.super__Deque_impl_data._M_start._M_last =
               local_168._M_impl.super__Deque_impl_data._M_start._M_cur + 10;
          local_168._M_impl.super__Deque_impl_data._M_start._M_first =
               local_168._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_168._M_impl.super__Deque_impl_data._M_start._M_node =
               local_168._M_impl.super__Deque_impl_data._M_start._M_node + 1;
        }
        else {
          local_168._M_impl.super__Deque_impl_data._M_start._M_cur =
               local_168._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
        }
        local_278 = local_278 + (double)local_1d8._0_8_;
        local_178 = local_278 - 9.223372036854776e+18;
        dStack_170 = dStack_270;
        local_1f8 = GraphBase::inf_eval(graph,&local_258,local_220._0_4_,10000);
        local_268 = (int)_Stack_1b0._M_head_impl;
        uStack_1f0 = extraout_XMM0_Qb_00;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"UC push new seed: ",0x12);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        if ((long)local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start == 0) {
          dVar19 = 0.0;
        }
        else {
          lVar14 = (long)local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          dVar19 = 0.0;
          lVar15 = 0;
          do {
            dVar19 = dVar19 + (local_1e0->super__Vector_base<double,_std::allocator<double>_>).
                              _M_impl.super__Vector_impl_data._M_start
                              [local_258.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start[lVar15]];
            lVar15 = lVar15 + 1;
          } while (lVar14 + (ulong)(lVar14 == 0) != lVar15);
        }
        poVar11 = std::ostream::_M_insert<double>(dVar19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
        poVar11 = std::ostream::_M_insert<double>(local_1f8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        uVar17 = (ulong)local_278;
        dVar19 = (double)((long)local_178 & (long)uVar17 >> 0x3f | uVar17);
      }
      else {
        local_178 = dVar19;
        if (local_1d8._24_4_ == local_268) {
          ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Head_base<1UL,_double,_false>._M_head_impl =
               ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
               super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
               super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
               super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
               super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
               super__Head_base<3UL,_double,_false>._M_head_impl;
        }
        else {
          if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_258,
                       (iterator)
                       local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&_Stack_1b0._M_head_impl);
          }
          else {
            *local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = _Stack_1b0._M_head_impl;
            local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          dVar19 = GraphBase::inf_eval(graph,&local_258,local_220._0_4_,10000);
          ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Head_base<1UL,_double,_false>._M_head_impl =
               (dVar19 - local_1f8) / (double)local_1d8._0_8_;
          iVar1._M_current =
               local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
          super__Head_base<2UL,_int,_false>._M_head_impl = local_27c;
          ptVar24 = (_Elt_pointer)(long)local_27c;
          local_1a0 = ptVar24;
          if (iVar1._M_current ==
              local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current;
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(&local_258,iVar1,(unsigned_long *)&local_1a0);
          }
          else {
            local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish[-1] = (unsigned_long)ptVar24;
          }
          if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_258,
                       (iterator)
                       local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&_Stack_1b0._M_head_impl);
          }
          else {
            *local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = _Stack_1b0._M_head_impl;
            local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          dVar19 = GraphBase::inf_eval(graph,&local_258,local_220._0_4_,10000);
          ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
          super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
          super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
          super__Tuple_impl<3UL,_double,_unsigned_long,_double>.super__Head_base<3UL,_double,_false>
          ._M_head_impl =
               (dVar19 - local_1f8) /
               ((double)local_1d8._0_8_ +
               (local_1e0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[(long)ptVar24]);
          local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + -2;
        }
        pptVar9 = local_168._M_impl.super__Deque_impl_data._M_finish._M_node;
        ptVar7 = local_168._M_impl.super__Deque_impl_data._M_finish._M_last;
        ptVar6 = local_168._M_impl.super__Deque_impl_data._M_finish._M_first;
        ptVar4 = local_168._M_impl.super__Deque_impl_data._M_finish._M_cur;
        pptVar5 = local_168._M_impl.super__Deque_impl_data._M_start._M_node;
        ptVar23 = local_168._M_impl.super__Deque_impl_data._M_start._M_last;
        ptVar24 = local_168._M_impl.super__Deque_impl_data._M_start._M_cur;
        if (local_27c == -1) {
          puVar13 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar13 = "cur_best_CB should not be -1";
          __cxa_throw(puVar13,&char_const*::typeinfo,0);
        }
        if ((double)local_180 <
            ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
            super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
            super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
            super__Head_base<1UL,_double,_false>._M_head_impl) {
          local_27c = (int)((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
                           super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>
                           ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
        }
        ((local_168._M_impl.super__Deque_impl_data._M_start._M_cur)->
        super__Tuple_impl<0UL,_unsigned_long,_double,_int,_double,_unsigned_long,_double>).
        super__Tuple_impl<1UL,_double,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<2UL,_int,_double,_unsigned_long,_double>.
        super__Tuple_impl<3UL,_double,_unsigned_long,_double>.
        super__Tuple_impl<4UL,_unsigned_long,_double>.super__Head_base<4UL,_unsigned_long,_false>.
        _M_head_impl = (long)local_258.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_258.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3;
        dVar19 = local_178;
        if (local_168._M_impl.super__Deque_impl_data._M_start._M_cur !=
            local_168._M_impl.super__Deque_impl_data._M_finish._M_cur) {
          local_1a0 = local_168._M_impl.super__Deque_impl_data._M_start._M_cur;
          local_b8 = local_168._M_impl.super__Deque_impl_data._M_start._M_first;
          local_198 = local_168._M_impl.super__Deque_impl_data._M_start._M_first;
          local_190 = local_168._M_impl.super__Deque_impl_data._M_start._M_last;
          local_188 = local_168._M_impl.super__Deque_impl_data._M_start._M_node;
          local_78 = local_168._M_impl.super__Deque_impl_data._M_finish._M_cur;
          local_70 = local_168._M_impl.super__Deque_impl_data._M_finish._M_first;
          local_68 = local_168._M_impl.super__Deque_impl_data._M_finish._M_last;
          local_60 = local_168._M_impl.super__Deque_impl_data._M_finish._M_node;
          uVar17 = ((long)local_168._M_impl.super__Deque_impl_data._M_start._M_last -
                    (long)local_168._M_impl.super__Deque_impl_data._M_start._M_cur >> 4) *
                   -0x5555555555555555 +
                   ((long)local_168._M_impl.super__Deque_impl_data._M_finish._M_cur -
                    (long)local_168._M_impl.super__Deque_impl_data._M_finish._M_first >> 4) *
                   -0x5555555555555555 +
                   (((long)local_168._M_impl.super__Deque_impl_data._M_finish._M_node -
                     (long)local_168._M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                   (ulong)(local_168._M_impl.super__Deque_impl_data._M_finish._M_node ==
                          (_Map_pointer)0x0)) * 10;
          lVar14 = 0x3f;
          if (uVar17 != 0) {
            for (; uVar17 >> lVar14 == 0; lVar14 = lVar14 + -1) {
            }
          }
          std::
          __introsort_loop<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,long,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>>
                    (&local_1a0,&local_78,((uint)lVar14 ^ 0x3f) * 2 ^ 0x7e);
          local_98 = ptVar24;
          local_90 = local_b8;
          local_88 = ptVar23;
          local_80 = pptVar5;
          local_58 = ptVar4;
          local_50 = ptVar6;
          local_48 = ptVar7;
          local_40 = pptVar9;
          std::
          __final_insertion_sort<std::_Deque_iterator<std::tuple<unsigned_long,double,int,double,unsigned_long,double>,std::tuple<unsigned_long,double,int,double,unsigned_long,double>&,std::tuple<unsigned_long,double,int,double,unsigned_long,double>*>,__gnu_cxx::__ops::_Iter_comp_iter<CELFPP::celfppalgo(std::vector<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>,std::allocator<std::vector<std::pair<unsigned_int,float>,std::allocator<std::pair<unsigned_int,float>>>>>const&,double,std::vector<double,std::allocator<double>>const&,CascadeModel)::_lambda(auto:1&,auto:2&)_4_>>
                    (&local_98,&local_58);
          dVar19 = local_178;
        }
      }
      auVar22._8_4_ = (int)((ulong)dVar19 >> 0x20);
      auVar22._0_8_ = dVar19;
      auVar22._12_4_ = 0x45300000;
      dStack_270 = auVar22._8_8_ - 1.9342813113834067e+25;
      local_278 = dStack_270 + ((double)CONCAT44(0x43300000,SUB84(dVar19,0)) - 4503599627370496.0);
    } while (local_278 < local_1a8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End CB",6);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  if (local_1f8 <= local_c8) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"UC_inf: ",8);
    poVar11 = std::ostream::_M_insert<double>(local_c8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    pvVar12 = &local_238;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CB_inf: ",8);
    poVar11 = std::ostream::_M_insert<double>(local_1f8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    pvVar12 = &local_258;
  }
  (local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start =
       (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish =
       (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (local_a0->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar12->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_218 != (unsigned_long *)0x0) {
    operator_delete(local_218,(long)local_208 - (long)local_218);
  }
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::~_Deque_base(&local_168);
  std::
  _Deque_base<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>,_std::allocator<std::tuple<unsigned_long,_double,_int,_double,_unsigned_long,_double>_>_>
  ::~_Deque_base(&local_118);
  if (local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_258.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_258.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_258.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_238.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_238.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_a0;
}

Assistant:

static std::vector<size_t> celfppalgo (const Graph & graph, const double budget,
            const std::vector<double> & budget_list, const CascadeModel model) {
        std::vector<size_t> S_UC;
        std::vector<size_t> S_CB;
        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::deque<std::tuple<size_t, double, int, double, size_t, double>> Q_UC;
        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::deque<std::tuple<size_t, double, int, double, size_t, double>> Q_CB;

        int last_seed = -1;
        int cur_best_UC = -1;
        double cur_best_UC_mg1 = 0;
        int cur_best_CB = -1;
        double cur_best_CB_mg1 = 0;
        double mg1_UC = 0;
        double mg1_CB = 0;
        double mg2_UC = 0;
        double mg2_CB = 0;
        std::cout << "Initial deque start" << std::endl;
        std::vector<size_t> vecSeed;
        for (size_t i = 0; i < graph.size(); i++) {
            vecSeed.push_back(i);

            // initial UC
            mg1_UC = GraphBase::inf_eval(graph, vecSeed, model);
            for (size_t j = 0; j < vecSeed.size(); j++) {
                std::cout << vecSeed[j] << " ";
            }
            std::cout << std::endl;
            if (cur_best_UC != -1) {
                vecSeed.push_back(cur_best_UC);
                mg2_UC = GraphBase::inf_eval(graph, vecSeed, model);
                for (size_t j = 0; j < vecSeed.size(); j++) {
                    std::cout << vecSeed[j] << " ";
                }
                std::cout << std::endl;
                vecSeed.pop_back();
            }
            else {
                mg2_UC = mg1_UC;
            }
            // u u.mg1 u.prev_best u.mg2 u.flag u.cost
            Q_UC.push_back(std::make_tuple(i, mg1_UC, cur_best_UC, mg2_UC, 0, budget_list[i]));
            if (cur_best_UC == -1) {
                cur_best_UC = i;
                cur_best_UC_mg1 = mg1_UC;
            }
            else {
                if(cur_best_UC_mg1 < mg1_UC) {
                    cur_best_UC = i;
                    cur_best_UC_mg1 = mg1_UC;
                }
            }

            // initial CB
            mg1_CB = mg1_UC / budget_list[i];
            if (cur_best_CB != -1) {
                vecSeed.push_back(cur_best_CB);
                mg2_CB = GraphBase::inf_eval(graph, vecSeed, model) / (budget_list[i] + budget_list[cur_best_CB]);
                for (size_t j = 0; j < vecSeed.size(); j++) {
                    std::cout << vecSeed[j] << " ";
                }
                std::cout << std::endl;
                vecSeed.pop_back();
            }
            else {
                mg2_CB = mg1_CB;
            }

            // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
            Q_CB.push_back(std::make_tuple(i, mg1_CB, cur_best_CB, mg2_CB, 0, budget_list[i]));
            if (cur_best_CB == -1) {
                cur_best_CB = i;
                cur_best_CB_mg1 = mg1_CB;
            }
            else {
                if (cur_best_CB_mg1 < mg1_CB) {
                    cur_best_CB = i;
                    cur_best_CB_mg1 = mg1_CB;
                }
            }
            vecSeed.pop_back();
        }
        std::cout << "Initial deque end" << std::endl;

        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<5>(left) < std::get<5>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
            if (std::get<1>(left) == std::get<1>(right)) {
                return std::get<5>(left) < std::get<5>(right);
            }
            else {
                return std::get<1>(left) > std::get<1>(right);
            }
        });

        // u u.mg1 u.prev_best u.mg2 u.flag u.cost
        std::cout << "Start UC" << std::endl;
        size_t budget_UC = 0;
        double S_UC_inf = 0;
        while (budget_UC < budget) {
            while (std::get<5>(Q_UC.front()) + budget_UC > budget) {
                Q_UC.pop_front();
                if (Q_UC.empty()) {
                    break;
                }
            }
            if (Q_UC.empty()) {
                break;
            }
            // u u.mg1 u.prev_best u.mg2 u.flag u.cost
            std::tuple<size_t, double, int, double, size_t, double> u = Q_UC.front();
            if (std::get<4>(u) == S_UC.size()) {
                S_UC.push_back(std::get<0>(u));
                Q_UC.pop_front();
                budget_UC = budget_UC + std::get<5>(u);
                S_UC_inf = GraphBase::inf_eval(graph, S_UC, model);
                last_seed = std::get<0>(u);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_UC.size() << " " <<
                          sum_budget(budget_list, S_UC) << " " << S_UC_inf << std::endl;
                continue;
            }
            else if (std::get<2>(u) == last_seed) {
                std::get<1>(Q_UC.front()) = std::get<3>(Q_UC.front());   // u u.mg1 u.prev_best u.mg2 u.flag u.cost
                std::cout << "last seed" << std::endl;
            }
            else {
                S_UC.push_back(std::get<0>(u));
                std::get<1>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                std::get<2>(Q_UC.front()) = cur_best_UC;
                S_UC.push_back(cur_best_UC);
                S_UC.push_back(std::get<0>(u));
                std::get<3>(Q_UC.front()) = GraphBase::inf_eval(graph, S_UC, model) - S_UC_inf;
                S_UC.pop_back();
                S_UC.pop_back();
            }

            if (cur_best_UC != -1){
                if (cur_best_UC_mg1 < std::get<1>(Q_UC.front())) {
                    cur_best_UC = std::get<0>(Q_UC.front());
                }
            }
            else {
                throw "cur_best_UC should not be -1";
            }

            std::get<4>(Q_UC.front()) = S_UC.size();
            std::sort(Q_UC.begin(), Q_UC.end(), [](auto & left, auto & right) {
                if (std::get<1>(left) == std::get<1>(right)) {
                    return std::get<5>(left) < std::get<5>(right);
                }
                else {
                    return std::get<1>(left) > std::get<1>(right);
                }
            });
        }
        std::cout << "End UC" << std::endl;

        // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
        std::cout << "Start CB" << std::endl;
        size_t budget_CB = 0;
        double S_CB_inf = 0;
        while (budget_CB < budget) {
            while (std::get<5>(Q_CB.front()) + budget_CB > budget) {
                Q_CB.pop_front();
                if (Q_CB.empty()) {
                    break;
                }
            }
            if (Q_CB.empty()) {
                break;
            }
            // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
            std::tuple<size_t, double, int, double, size_t, double> u = Q_CB.front();
            if (std::get<4>(u) == S_CB.size()) {
                S_CB.push_back(std::get<0>(u));
                Q_CB.pop_front();
                budget_CB = budget_CB + std::get<5>(u);
                S_CB_inf = GraphBase::inf_eval(graph, S_CB, model);
                last_seed = std::get<0>(u);
                std::cout << "UC push new seed: " << std::get<0>(u) << " " << S_CB.size() << " " <<
                          sum_budget(budget_list, S_CB) << " " << S_CB_inf << std::endl;
                continue;
            }
            else if (std::get<2>(u) == last_seed) {
                // u u.mg1/u.cost u.prev_best u.mg2/(u.cost + u.prev_best.cost) u.flag u.cost
                std::get<1>(Q_CB.front()) = std::get<3>(Q_CB.front());
            }
            else {
                S_CB.push_back(std::get<0>(u));
                std::get<1>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) / std::get<5>(u);
                S_CB.pop_back();
                std::get<2>(Q_CB.front()) = cur_best_CB;
                S_CB.push_back(cur_best_CB);
                S_CB.push_back(std::get<0>(u));
                std::get<3>(Q_CB.front()) = (GraphBase::inf_eval(graph, S_CB, model) - S_CB_inf) /
                        (std::get<5>(u) + budget_list[cur_best_CB]);
                S_CB.pop_back();
                S_CB.pop_back();
            }
            if (cur_best_CB != -1){
                if(cur_best_CB_mg1 < std::get<1>(Q_CB.front())){
                    cur_best_CB = std::get<0>(Q_CB.front());
                }
            }
            else {
                throw "cur_best_CB should not be -1";
            }
            std::get<4>(Q_CB.front()) = S_CB.size();
            std::sort(Q_CB.begin(), Q_CB.end(), [](auto & left, auto & right) {
                if (std::get<1>(left) == std::get<1>(right)) {
                    return std::get<5>(left) < std::get<5>(right);
                }
                else {
                    return std::get<1>(left) > std::get<1>(right);
                }
            });
        }
        std::cout << "End CB" << std::endl;

        if (S_CB_inf > S_UC_inf) {
            std::cout << "CB_inf: " << S_CB_inf << std::endl;
            return S_CB;
        }
        else {
            std::cout << "UC_inf: " << S_UC_inf << std::endl;
            return S_UC;
        }
    }